

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::char_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,align_spec *spec,char_writer *f)

{
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar1;
  char_type cVar2;
  ulong uVar3;
  char __tmp;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar4;
  ulong uVar5;
  char_type *pcVar6;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  *pbVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  bVar12;
  ulong uVar13;
  char_type local_40 [8];
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  local_38 [8];
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  local_30 [8];
  char_type local_28 [8];
  
  uVar10 = (ulong)spec->width_;
  if (uVar10 < 2) {
    cVar2 = f->value;
    pcVar6 = *(char_type **)this;
    uVar10 = *(ulong *)(this + 0x10);
    *(ulong *)(this + 0x10) = uVar10 + 1;
    if (uVar10 < *(ulong *)(this + 8)) {
      *(char_type **)this = pcVar6 + 1;
    }
    else {
      pcVar6 = local_40;
    }
    *pcVar6 = cVar2;
  }
  else {
    bVar1 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
              *)&spec->fill_;
    uVar5 = uVar10 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar8 = uVar5 >> 1;
      pbVar7 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar11 = *(ulong *)(this + 0x10);
      bVar4 = this[0x18];
      uVar13 = uVar8;
      bVar12 = bVar4;
      if (spec->width_ != 2) {
        do {
          bVar4 = bVar1;
          if (uVar11 < uVar3) {
            *pbVar7 = bVar1;
            bVar4 = bVar12;
          }
          pbVar7 = pbVar7 + (uVar11 < uVar3);
          uVar11 = uVar11 + 1;
          uVar13 = uVar13 - 1;
          bVar12 = bVar4;
        } while (uVar13 != 0);
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar7;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar11;
      this[0x18] = bVar4;
      bVar4 = (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               )f->value;
      *(ulong *)(this + 0x10) = uVar11 + 1;
      if (uVar11 < uVar3) {
        *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
          **)this = pbVar7 + 1;
      }
      else {
        pbVar7 = local_30;
      }
      *pbVar7 = bVar4;
      pbVar7 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar11 = *(ulong *)(this + 0x10);
      bVar4 = this[0x18];
      if (uVar5 != uVar8) {
        lVar9 = (uVar8 - uVar10) + 1;
        bVar12 = bVar4;
        do {
          bVar4 = bVar1;
          if (uVar11 < uVar3) {
            *pbVar7 = bVar1;
            bVar4 = bVar12;
          }
          pbVar7 = pbVar7 + (uVar11 < uVar3);
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 1;
          bVar12 = bVar4;
        } while (lVar9 != 0);
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar7;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar11;
      this[0x18] = bVar4;
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pbVar7 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar11 = *(ulong *)(this + 8);
      uVar10 = *(ulong *)(this + 0x10);
      bVar4 = this[0x18];
      for (; uVar5 != 0; uVar5 = uVar5 - 1) {
        bVar12 = bVar1;
        if (uVar10 < uVar11) {
          *pbVar7 = bVar1;
          bVar12 = bVar4;
        }
        pbVar7 = pbVar7 + (uVar10 < uVar11);
        uVar10 = uVar10 + 1;
        bVar4 = bVar12;
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar7;
      *(ulong *)(this + 8) = uVar11;
      *(ulong *)(this + 0x10) = uVar10;
      this[0x18] = bVar4;
      bVar1 = (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               )f->value;
      *(ulong *)(this + 0x10) = uVar10 + 1;
      if (uVar10 < uVar11) {
        *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
          **)this = pbVar7 + 1;
      }
      else {
        pbVar7 = local_38;
      }
      *pbVar7 = bVar1;
    }
    else {
      cVar2 = f->value;
      pcVar6 = *(char_type **)this;
      uVar10 = *(ulong *)(this + 0x10);
      *(ulong *)(this + 0x10) = uVar10 + 1;
      if (uVar10 < *(ulong *)(this + 8)) {
        *(char_type **)this = pcVar6 + 1;
      }
      else {
        pcVar6 = local_28;
      }
      *pcVar6 = cVar2;
      pbVar7 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                 **)this;
      uVar11 = *(ulong *)(this + 8);
      uVar10 = *(ulong *)(this + 0x10);
      bVar4 = this[0x18];
      for (; uVar5 != 0; uVar5 = uVar5 - 1) {
        bVar12 = bVar1;
        if (uVar10 < uVar11) {
          *pbVar7 = bVar1;
          bVar12 = bVar4;
        }
        pbVar7 = pbVar7 + (uVar10 < uVar11);
        uVar10 = uVar10 + 1;
        bVar4 = bVar12;
      }
      *(basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
        **)this = pbVar7;
      *(ulong *)(this + 8) = uVar11;
      *(ulong *)(this + 0x10) = uVar10;
      this[0x18] = bVar4;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR unsigned width() const { return width_; }